

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigDecimal.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLBigDecimal::XMLBigDecimal
          (XMLBigDecimal *this,XMLCh *strValue,MemoryManager *manager)

{
  XMLCh *pXVar1;
  int iVar2;
  XMLSize_t XVar3;
  undefined4 extraout_var;
  NumberFormatException *this_00;
  CleanupType_conflict3 cleanup;
  
  XMLNumber::XMLNumber(&this->super_XMLNumber);
  (this->super_XMLNumber).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__XMLBigDecimal_003faf40;
  this->fSign = 0;
  this->fTotalDigits = 0;
  this->fScale = 0;
  this->fIntVal = (XMLCh *)0x0;
  this->fRawDataLen = 0;
  this->fRawData = (XMLCh *)0x0;
  this->fMemoryManager = manager;
  if ((strValue != (XMLCh *)0x0) && (*strValue != L'\0')) {
    cleanup.fToCall = (MFPT)cleanUp;
    cleanup._16_8_ = 0;
    cleanup.fObject = this;
    XVar3 = XMLString::stringLen(strValue);
    this->fRawDataLen = XVar3;
    iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,XVar3 * 4 + 4);
    this->fRawData = (XMLCh *)CONCAT44(extraout_var,iVar2);
    memcpy((XMLCh *)CONCAT44(extraout_var,iVar2),strValue,this->fRawDataLen * 2);
    pXVar1 = this->fRawData + this->fRawDataLen;
    *pXVar1 = L'\0';
    this->fIntVal = pXVar1 + 1;
    parseDecimal(strValue,pXVar1 + 1,&this->fSign,(int *)&this->fTotalDigits,(int *)&this->fScale,
                 this->fMemoryManager);
    cleanup.fObject = (XMLBigDecimal *)0x0;
    JanitorMemFunCall<xercesc_4_0::XMLBigDecimal>::~JanitorMemFunCall(&cleanup);
    return;
  }
  this_00 = (NumberFormatException *)__cxa_allocate_exception(0x30);
  NumberFormatException::NumberFormatException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
             ,0x40,XMLNUM_emptyString,this->fMemoryManager);
  __cxa_throw(this_00,&NumberFormatException::typeinfo,XMLException::~XMLException);
}

Assistant:

XMLBigDecimal::XMLBigDecimal(const XMLCh* const strValue,
                             MemoryManager* const manager)
: fSign(0)
, fTotalDigits(0)
, fScale(0)
, fRawDataLen(0)
, fRawData(0)
, fIntVal(0)
, fMemoryManager(manager)
{
    if ((!strValue) || (!*strValue))
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_emptyString, fMemoryManager);

    CleanupType cleanup(this, &XMLBigDecimal::cleanUp);

    try
    {
        fRawDataLen = XMLString::stringLen(strValue);
        fRawData = (XMLCh*) fMemoryManager->allocate
        (
            ((fRawDataLen*2) + 2) * sizeof(XMLCh) //fRawData and fIntVal
        );
        memcpy(fRawData, strValue, fRawDataLen * sizeof(XMLCh));
        fRawData[fRawDataLen] = chNull;
        fIntVal = fRawData + fRawDataLen + 1;
        parseDecimal(strValue, fIntVal, fSign, (int&) fTotalDigits, (int&) fScale, fMemoryManager);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}